

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb.cc
# Opt level: O1

void CB::parse_label(parser *p,shared_data *param_2,void *v,v_array<substring> *words)

{
  v_array<substring> *ret;
  substring *psVar1;
  bool bVar2;
  substring *psVar3;
  uint64_t uVar4;
  ostream *poVar5;
  vw_exception *pvVar6;
  char *str;
  long lVar7;
  ulong uVar8;
  anon_union_4_2_947300a4 x;
  substring s;
  substring ss;
  cb_class f;
  stringstream __msg;
  cb_class local_238;
  v_array<CB::cb_class> *local_228;
  v_array<substring> *local_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  psVar3 = words->_begin;
  if (words->_end != psVar3) {
    ret = &p->parse_name;
    lVar7 = 8;
    uVar8 = 0;
    local_228 = (v_array<CB::cb_class> *)v;
    local_220 = words;
    do {
      s.end = *(char **)((long)&psVar3->begin + lVar7);
      s.begin = *(char **)((long)psVar3 + lVar7 + -8);
      tokenize<v_array<substring>>(':',s,ret,false);
      psVar3 = (p->parse_name)._begin;
      psVar1 = (p->parse_name)._end;
      if ((psVar1 == psVar3) || (0x30 < (ulong)((long)psVar1 - (long)psVar3))) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,"malformed cost specification: ",0x1e);
        ::operator<<(&local_1a8,ret);
        pvVar6 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cb.cc"
                   ,0x7a,&local_1d8);
        __cxa_throw(pvVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      local_238.partial_prediction = 0.0;
      uVar4 = hashstring(*psVar3,0);
      local_238.action = (uint32_t)uVar4;
      local_238.cost = 3.4028235e+38;
      psVar3 = (p->parse_name)._begin;
      if (0x10 < (ulong)((long)(p->parse_name)._end - (long)psVar3)) {
        local_238.cost = float_of_substring(psVar3[1]);
      }
      if ((~(uint)local_238.cost & 0x7fc00000) == 0) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"error NaN cost (",0x10);
        poVar5 = ::operator<<(&local_1a8,ret->_begin + 1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," for action: ",0xd);
        ::operator<<(poVar5,ret->_begin);
        pvVar6 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cb.cc"
                   ,0x84,&local_1f8);
        __cxa_throw(pvVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      local_238.probability = 0.0;
      psVar3 = (p->parse_name)._begin;
      str = (char *)((long)(p->parse_name)._end - (long)psVar3);
      if ((char *)0x20 < str) {
        local_238.probability = float_of_substring(psVar3[2]);
      }
      if ((~(uint)local_238.probability & 0x7fc00000) == 0) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,"error NaN probability (",0x17);
        poVar5 = ::operator<<(&local_1a8,ret->_begin + 2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," for action: ",0xd);
        ::operator<<(poVar5,ret->_begin);
        pvVar6 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cb.cc"
                   ,0x8b,&local_218);
        __cxa_throw(pvVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      if (1.0 < local_238.probability) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "invalid probability > 1 specified for an action, resetting to 1.",0x40);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
        std::ostream::put('8');
        std::ostream::flush();
        local_238.probability = 1.0;
      }
      if (local_238.probability < 0.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "invalid probability < 0 specified for an action, resetting to 0.",0x40);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
        std::ostream::put('8');
        std::ostream::flush();
        local_238.probability = 0.0;
      }
      psVar3 = ret->_begin;
      ss.end = "shared";
      ss.begin = psVar3->end;
      bVar2 = substring_eq((CB *)psVar3->begin,ss,str);
      if (bVar2) {
        if ((long)(p->parse_name)._end - (long)psVar3 == 0x10) {
          local_238.probability = -1.0;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"shared feature vectors should not have costs",0x2c);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
          std::ostream::put('8');
          std::ostream::flush();
        }
      }
      v_array<CB::cb_class>::push_back(local_228,&local_238);
      uVar8 = uVar8 + 1;
      psVar3 = local_220->_begin;
      lVar7 = lVar7 + 0x10;
    } while (uVar8 < (ulong)((long)local_220->_end - (long)psVar3 >> 4));
  }
  return;
}

Assistant:

void parse_label(parser* p, shared_data*, void* v, v_array<substring>& words)
{
  CB::label* ld = (CB::label*)v;
  for (size_t i = 0; i < words.size(); i++)
  {
    cb_class f;
    tokenize(':', words[i], p->parse_name);

    if (p->parse_name.size() < 1 || p->parse_name.size() > 3)
      THROW("malformed cost specification: " << p->parse_name);

    f.partial_prediction = 0.;
    f.action = (uint32_t)hashstring(p->parse_name[0], 0);
    f.cost = FLT_MAX;

    if (p->parse_name.size() > 1)
      f.cost = float_of_substring(p->parse_name[1]);

    if (nanpattern(f.cost))
      THROW("error NaN cost (" << p->parse_name[1] << " for action: " << p->parse_name[0]);

    f.probability = .0;
    if (p->parse_name.size() > 2)
      f.probability = float_of_substring(p->parse_name[2]);

    if (nanpattern(f.probability))
      THROW("error NaN probability (" << p->parse_name[2] << " for action: " << p->parse_name[0]);

    if (f.probability > 1.0)
    {
      cerr << "invalid probability > 1 specified for an action, resetting to 1." << endl;
      f.probability = 1.0;
    }
    if (f.probability < 0.0)
    {
      cerr << "invalid probability < 0 specified for an action, resetting to 0." << endl;
      f.probability = .0;
    }
    if (substring_eq(p->parse_name[0], "shared"))
    {
      if (p->parse_name.size() == 1)
      {
        f.probability = -1.f;
      }
      else
        cerr << "shared feature vectors should not have costs" << endl;
    }

    ld->costs.push_back(f);
  }
}